

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RealSpaceTest.cpp
# Opt level: O0

void __thiscall RandomRealPointConstructor::test_method(RandomRealPointConstructor *this)

{
  undefined8 uVar1;
  bool bVar2;
  byte bVar3;
  lazy_ostream *plVar4;
  basic_cstring<const_char> local_2b8;
  basic_cstring<const_char> local_2a8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_298;
  assertion_result local_278;
  basic_cstring<const_char> local_260;
  basic_cstring<const_char> local_250;
  undefined4 local_23c;
  EigenBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
  local_238 [24];
  Index local_220;
  basic_cstring<const_char> local_218;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_208;
  basic_cstring<const_char> local_1e0;
  basic_cstring<const_char> local_1d0 [2];
  Point local_1b0 [8];
  Point y;
  RealSpace local_88 [8];
  RealSpace R3;
  RandomRealPointConstructor *this_local;
  
  mnf::RealSpace::RealSpace(local_88,3);
  mnf::Manifold::createRandomPoint(1.0);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_1d0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/RealSpaceTest.cpp"
               ,0x6e);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1e0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,local_1d0,0x42,&local_1e0);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_208,plVar4,(char (*) [1])0x18b264);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_218,
               "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/RealSpaceTest.cpp"
               ,0x6e);
    mnf::SubPoint::value();
    local_220 = Eigen::
                EigenBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>_>
                ::size(local_238);
    local_23c = 3;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
              (&local_208,&local_218,0x42,1,2,&local_220,"y.value().size()",&local_23c,"3");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_208);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_250,
               "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/RealSpaceTest.cpp"
               ,0x6e);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_260);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_250,0x43,&local_260);
    bVar3 = mnf::Point::isInM(1e-12);
    boost::test_tools::assertion_result::assertion_result(&local_278,(bool)(bVar3 & 1));
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2a8,"y.isInM()",9);
    boost::unit_test::operator<<(&local_298,plVar4,&local_2a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2b8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/RealSpaceTest.cpp"
               ,0x6e);
    boost::test_tools::tt_detail::report_assertion(&local_278,&local_298,&local_2b8,0x43,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_298);
    boost::test_tools::assertion_result::~assertion_result(&local_278);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  mnf::Point::~Point(local_1b0);
  mnf::RealSpace::~RealSpace(local_88);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(RandomRealPointConstructor)
{
  RealSpace R3(3);
  Point y = R3.createRandomPoint();
  BOOST_CHECK_EQUAL(y.value().size(), 3);
  BOOST_CHECK(y.isInM());
}